

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucurr.cpp
# Opt level: O2

void initCurrSymbolsEquiv(void)

{
  Key key;
  UBool UVar1;
  Hashtable *this;
  UnicodeSet *pUVar2;
  UnicodeString *pUVar3;
  UnicodeSet *that;
  UnicodeSet *this_00;
  UnicodeString *this_01;
  long lVar4;
  code *pcVar5;
  UErrorCode status;
  UnicodeSet *local_130;
  long local_128;
  EquivIterator local_120;
  EquivIterator leftIter;
  UnicodeSetIterator it;
  UnicodeString exemplar;
  UnicodeString local_70;
  
  status = U_ZERO_ERROR;
  pcVar5 = currency_cleanup;
  ucln_common_registerCleanup_63(UCLN_COMMON_CURRENCY,currency_cleanup);
  this = (Hashtable *)icu_63::UMemory::operator_new((UMemory *)0x58,(size_t)pcVar5);
  if (this != (Hashtable *)0x0) {
    pcVar5 = (code *)&status;
    icu_63::Hashtable::Hashtable(this,(UErrorCode *)pcVar5);
    if (status < U_ILLEGAL_ARGUMENT_ERROR) {
      pcVar5 = deleteUnicode;
      icu_63::Hashtable::setValueDeleter(this,deleteUnicode);
      if (status < U_ILLEGAL_ARGUMENT_ERROR) {
        lVar4 = 0;
        while (lVar4 != 0x20) {
          key = *(Key *)((long)&icu_63::unisets::kCurrencyEntries + lVar4);
          pcVar5 = (code *)(ulong)*(uint *)((long)&DAT_0031d884 + lVar4);
          local_128 = lVar4;
          icu_63::UnicodeString::UnicodeString(&exemplar,*(uint *)((long)&DAT_0031d884 + lVar4));
          pUVar2 = icu_63::unisets::get(key);
          if (pUVar2 == (UnicodeSet *)0x0) {
            icu_63::UnicodeString::~UnicodeString(&exemplar);
            break;
          }
          icu_63::UnicodeSetIterator::UnicodeSetIterator(&it,pUVar2);
          pcVar5 = (code *)pUVar2;
          while (UVar1 = icu_63::UnicodeSetIterator::next(&it), UVar1 != '\0') {
            pUVar3 = icu_63::UnicodeSetIterator::getString(&it);
            icu_63::UnicodeString::UnicodeString(&local_70,pUVar3);
            pcVar5 = (code *)&exemplar;
            UVar1 = icu_63::UnicodeString::operator==(&local_70,&exemplar);
            if (UVar1 == '\0') {
              if (status < U_ILLEGAL_ARGUMENT_ERROR) {
                pcVar5 = (code *)&local_70;
                UVar1 = icu_63::UnicodeString::operator==(&exemplar,&local_70);
                if (UVar1 == '\0') {
                  local_120._hash = this;
                  local_120._start = &local_70;
                  local_120._current = &local_70;
                  leftIter._hash = this;
                  leftIter._start = &exemplar;
                  leftIter._current = &exemplar;
                  local_130 = (UnicodeSet *)icu_63::EquivIterator::next(&leftIter);
                  that = (UnicodeSet *)icu_63::EquivIterator::next(&local_120);
                  pUVar2 = that;
                  this_00 = local_130;
                  while ((pUVar2 != (UnicodeSet *)0x0 && (this_00 != (UnicodeSet *)0x0))) {
                    pcVar5 = (code *)&local_70;
                    UVar1 = icu_63::UnicodeString::operator==((UnicodeString *)this_00,&local_70);
                    if ((UVar1 != '\0') ||
                       (pcVar5 = (code *)&exemplar,
                       UVar1 = icu_63::UnicodeString::operator==((UnicodeString *)pUVar2,&exemplar),
                       UVar1 != '\0')) goto LAB_002987f9;
                    this_00 = (UnicodeSet *)icu_63::EquivIterator::next(&leftIter);
                    pUVar2 = (UnicodeSet *)icu_63::EquivIterator::next(&local_120);
                  }
                  pUVar3 = (UnicodeString *)
                           icu_63::UMemory::operator_new((UMemory *)0x40,(size_t)pcVar5);
                  if (local_130 == (UnicodeSet *)0x0 && that == (UnicodeSet *)0x0) {
                    if (pUVar3 != (UnicodeString *)0x0) {
                      pcVar5 = (code *)&local_70;
                      icu_63::UnicodeString::UnicodeString(pUVar3,&local_70);
                    }
                    this_01 = (UnicodeString *)
                              icu_63::UMemory::operator_new((UMemory *)0x40,(size_t)pcVar5);
                    if (this_01 == (UnicodeString *)0x0) goto LAB_002989ae;
                    pcVar5 = (code *)&exemplar;
                    icu_63::UnicodeString::UnicodeString(this_01,&exemplar);
LAB_0029897e:
                    if (pUVar3 != (UnicodeString *)0x0) {
                      icu_63::Hashtable::put(this,&exemplar,pUVar3,&status);
                      pcVar5 = (code *)&local_70;
                      icu_63::Hashtable::put(this,&local_70,this_01,&status);
                      goto LAB_002987f9;
                    }
LAB_002989b8:
                    (*(this_01->super_Replaceable).super_UObject._vptr_UObject[1])(this_01);
                  }
                  else {
                    if (that == (UnicodeSet *)0x0) {
                      if (pUVar3 != (UnicodeString *)0x0) {
                        pcVar5 = (code *)&local_70;
                        icu_63::UnicodeString::UnicodeString(pUVar3,&local_70);
                      }
                      this_01 = (UnicodeString *)
                                icu_63::UMemory::operator_new((UMemory *)0x40,(size_t)pcVar5);
                      if (this_01 == (UnicodeString *)0x0) goto LAB_002989ae;
                      pcVar5 = (code *)local_130;
                      icu_63::UnicodeString::UnicodeString(this_01,(UnicodeString *)local_130);
                      goto LAB_0029897e;
                    }
                    if (local_130 == (UnicodeSet *)0x0) {
                      if (pUVar3 != (UnicodeString *)0x0) {
                        icu_63::UnicodeString::UnicodeString(pUVar3,(UnicodeString *)that);
                        pcVar5 = (code *)that;
                      }
                      this_01 = (UnicodeString *)
                                icu_63::UMemory::operator_new((UMemory *)0x40,(size_t)pcVar5);
                      if (this_01 == (UnicodeString *)0x0) goto LAB_002989ae;
                      pcVar5 = (code *)&exemplar;
                      icu_63::UnicodeString::UnicodeString(this_01,&exemplar);
                      goto LAB_0029897e;
                    }
                    if (pUVar3 != (UnicodeString *)0x0) {
                      icu_63::UnicodeString::UnicodeString(pUVar3,(UnicodeString *)that);
                      pcVar5 = (code *)that;
                    }
                    this_01 = (UnicodeString *)
                              icu_63::UMemory::operator_new((UMemory *)0x40,(size_t)pcVar5);
                    if (this_01 != (UnicodeString *)0x0) {
                      pcVar5 = (code *)local_130;
                      icu_63::UnicodeString::UnicodeString(this_01,(UnicodeString *)local_130);
                      goto LAB_0029897e;
                    }
LAB_002989ae:
                    this_01 = pUVar3;
                    if (pUVar3 != (UnicodeString *)0x0) goto LAB_002989b8;
                  }
                  status = U_MEMORY_ALLOCATION_ERROR;
                }
LAB_002987f9:
                if (status < U_ILLEGAL_ARGUMENT_ERROR) goto LAB_00298804;
              }
              icu_63::UnicodeString::~UnicodeString(&local_70);
              icu_63::UnicodeSetIterator::~UnicodeSetIterator(&it);
              icu_63::UnicodeString::~UnicodeString(&exemplar);
              goto LAB_00298a16;
            }
LAB_00298804:
            icu_63::UnicodeString::~UnicodeString((UnicodeString *)&local_70);
          }
          icu_63::UnicodeSetIterator::~UnicodeSetIterator(&it);
          icu_63::UnicodeString::~UnicodeString((UnicodeString *)&exemplar);
          lVar4 = local_128 + 8;
        }
LAB_00298a16:
        if (status < U_ILLEGAL_ARGUMENT_ERROR) {
          gCurrSymbolsEquiv = this;
          return;
        }
      }
    }
    icu_63::Hashtable::~Hashtable(this);
    icu_63::UMemory::operator_delete((UMemory *)this,pcVar5);
  }
  return;
}

Assistant:

static void U_CALLCONV initCurrSymbolsEquiv() {
    U_ASSERT(gCurrSymbolsEquiv == NULL);
    UErrorCode status = U_ZERO_ERROR;
    ucln_common_registerCleanup(UCLN_COMMON_CURRENCY, currency_cleanup);
    icu::Hashtable *temp = new icu::Hashtable(status);
    if (temp == NULL) {
        return;
    }
    if (U_FAILURE(status)) {
        delete temp;
        return;
    }
    temp->setValueDeleter(deleteUnicode);
    populateCurrSymbolsEquiv(temp, status);
    if (U_FAILURE(status)) {
        delete temp;
        return;
    }
    gCurrSymbolsEquiv = temp;
}